

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssembly.cpp
# Opt level: O3

bool Js::WebAssembly::IsResponseObject(Var responseObject,ScriptContext *scriptContext)

{
  Type TVar1;
  bool bVar2;
  RecyclableObject *pRVar3;
  
  bVar2 = VarIs<Js::RecyclableObject>(responseObject);
  if (bVar2) {
    pRVar3 = VarTo<Js::RecyclableObject>(responseObject);
    TVar1 = ((pRVar3->type).ptr)->typeId;
    if (DAT_015932e4 == '\0') {
      bVar2 = TVar1 != TypeIds_Undefined &&
              (scriptContext->threadContext->super_ThreadContextInfo).wellKnownHostTypeIds[1] ==
              TVar1;
    }
    else {
      bVar2 = TVar1 == TypeIds_Object;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool WebAssembly::IsResponseObject(Var responseObject, ScriptContext* scriptContext)
{
    if (!VarIs<RecyclableObject>(responseObject))
    {
        return false;
    }
    TypeId typeId = VarTo<RecyclableObject>(responseObject)->GetTypeId();
    if (!CONFIG_FLAG(WasmIgnoreResponse))
    {
        return scriptContext->IsWellKnownHostType<WellKnownHostType_Response>(typeId) && typeId != TypeIds_Undefined;
    }
    // Consider all object as Response objects under -wasmIgnoreResponse
    return typeId == TypeIds_Object;
}